

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

void IoTHubMessaging_LL_Close(IOTHUB_MESSAGING_HANDLE messagingHandle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Close",0x569,1,"Input parameter cannot be NULL");
    }
  }
  else {
    messagesender_destroy(messagingHandle->message_sender);
    messagereceiver_destroy(messagingHandle->message_receiver);
    link_destroy(messagingHandle->sender_link);
    link_destroy(messagingHandle->receiver_link);
    session_destroy(messagingHandle->session);
    connection_destroy(messagingHandle->connection);
    xio_destroy(messagingHandle->sasl_io);
    xio_destroy(messagingHandle->tls_io);
    saslmechanism_destroy(messagingHandle->sasl_mechanism_handle);
    if ((messagingHandle->sasl_plain_config).authcid != (char *)0x0) {
      free((messagingHandle->sasl_plain_config).authcid);
    }
    if ((messagingHandle->sasl_plain_config).passwd != (char *)0x0) {
      free((messagingHandle->sasl_plain_config).passwd);
    }
    if ((messagingHandle->sasl_plain_config).authzid != (char *)0x0) {
      free((messagingHandle->sasl_plain_config).authzid);
    }
    messagingHandle->isOpened = 0;
  }
  return;
}

Assistant:

void IoTHubMessaging_LL_Close(IOTHUB_MESSAGING_HANDLE messagingHandle)
{
    if (messagingHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
    }
    else
    {
        messagesender_destroy(messagingHandle->message_sender);
        messagereceiver_destroy(messagingHandle->message_receiver);

        link_destroy(messagingHandle->sender_link);
        link_destroy(messagingHandle->receiver_link);

        session_destroy(messagingHandle->session);
        connection_destroy(messagingHandle->connection);
        xio_destroy(messagingHandle->sasl_io);
        xio_destroy(messagingHandle->tls_io);
        saslmechanism_destroy(messagingHandle->sasl_mechanism_handle);

        if (messagingHandle->sasl_plain_config.authcid != NULL)
        {
            free((char*)messagingHandle->sasl_plain_config.authcid);
        }
        if (messagingHandle->sasl_plain_config.passwd != NULL)
        {
            free((char*)messagingHandle->sasl_plain_config.passwd);
        }
        if (messagingHandle->sasl_plain_config.authzid != NULL)
        {
            free((char*)messagingHandle->sasl_plain_config.authzid);
        }
        messagingHandle->isOpened = false;
    }
}